

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblecache.cpp
# Opt level: O1

Id __thiscall QAccessibleCache::idForObject(QAccessibleCache *this,QObject *obj)

{
  pair<unsigned_int,_const_QMetaObject_*> *ppVar1;
  QMetaObject *pQVar2;
  iterator iVar3;
  iterator iVar4;
  Id IVar5;
  QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *this_00;
  pair<unsigned_int,_const_QMetaObject_*> *ppVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QList<std::pair<unsigned_int,_const_QMetaObject_*>_> local_50;
  QObject *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = obj;
  if (obj != (QObject *)0x0) {
    pQVar2 = (QMetaObject *)(*(code *)**(undefined8 **)obj)(obj);
    this_00 = (QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *)(this + 0x20);
    QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::valuesImpl<QObject*>
              (&local_50,this_00,&local_38);
    iVar3 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::begin(&local_50);
    iVar4 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::end(&local_50);
    bVar7 = iVar3.i == iVar4.i;
    if ((!bVar7) &&
       (this_00 = (QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *)
                  (ulong)(iVar3.i)->first, (iVar3.i)->second != pQVar2)) {
      do {
        ppVar6 = iVar3.i + 1;
        bVar7 = ppVar6 == iVar4.i;
        if (bVar7) goto LAB_00594629;
        ppVar1 = iVar3.i + 1;
        iVar3.i = ppVar6;
      } while (ppVar1->second != pQVar2);
      this_00 = (QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *)
                (ulong)ppVar6->first;
    }
LAB_00594629:
    IVar5 = (Id)this_00;
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,0x10,0x10);
      }
    }
    if (!bVar7) goto LAB_00594653;
  }
  IVar5 = 0;
LAB_00594653:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return IVar5;
  }
  __stack_chk_fail();
}

Assistant:

QAccessible::Id QAccessibleCache::idForObject(QObject *obj) const
{
    if (obj) {
        const QMetaObject *mo = obj->metaObject();
        for (auto pair : objectToId.values(obj)) {
            if (pair.second == mo) {
                return pair.first;
            }
        }
    }
    return 0;
}